

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int bmcg_sat_solver_equiv_overlap_check
              (bmcg_sat_solver *pSat,Gia_Man_t *p,int iLit0,int iLit1,int fEquiv)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  Vec_Int_t *p_01;
  int Fill;
  int iVar4;
  SimpSolver *S;
  int local_58;
  int local_54;
  SimpSolver *local_50;
  bmcg_sat_solver *pSats [2];
  
  pSats[1] = (bmcg_sat_solver *)0x0;
  local_50 = (SimpSolver *)pSat;
  pSats[0] = pSat;
  p_01 = Vec_IntAlloc(100);
  p_00 = &p->vCopies;
  if ((p->vCopies).nSize < p->nObjs) {
    Vec_IntFillExtra(p_00,p->nObjs,Fill);
  }
  iVar1 = p_01->nSize;
  iVar4 = 0;
  Vec_IntPush(p_01,0);
  Vec_IntWriteEntry(p_00,0,iVar1);
  if (iVar1 == 0) {
    iVar1 = Abc_Lit2Var(iLit0);
    iVar1 = Gia_ManSatAndCollect_rec(p,iVar1,p_01,(Vec_Int_t *)0x0);
    iVar2 = Abc_Lit2Var(iLit1);
    iVar2 = Gia_ManSatAndCollect_rec(p,iVar2,p_01,(Vec_Int_t *)0x0);
    iVar3 = Abc_LitIsCompl(iLit0);
    iVar3 = Abc_Var2Lit(iVar1,iVar3);
    iVar1 = Abc_LitIsCompl(iLit1);
    iVar2 = Abc_Var2Lit(iVar2,iVar1);
    Gia_ManQuantLoadCnf(p,p_01,pSats);
    iVar1 = -1;
    for (; iVar4 < p_01->nSize; iVar4 = iVar4 + 1) {
      i = Vec_IntEntry(p_01,iVar4);
      Vec_IntWriteEntry(p_00,i,-1);
    }
    Vec_IntFree(p_01);
    local_58 = iVar3;
    if (fEquiv == 0) {
      iVar1 = 1;
      S = local_50;
    }
    else {
      local_54 = Abc_LitNot(iVar2);
      S = local_50;
      iVar4 = glucose_solver_solve(local_50,&local_58,2);
      if (iVar4 != -1) {
        return 0;
      }
      local_58 = Abc_LitNot(iVar3);
    }
    local_54 = iVar2;
    iVar4 = glucose_solver_solve(S,&local_58,2);
    return (uint)(iVar4 == iVar1);
  }
  __assert_fail("iVar == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                ,0x4e3,
                "int bmcg_sat_solver_equiv_overlap_check(bmcg_sat_solver *, Gia_Man_t *, int, int, int)"
               );
}

Assistant:

int bmcg_sat_solver_equiv_overlap_check( bmcg_sat_solver * pSat, Gia_Man_t * p, int iLit0, int iLit1, int fEquiv )
{
    bmcg_sat_solver * pSats[2] = { pSat, NULL };
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); 
    int i, iVar, iSatVar[2], iSatLit[2], Lits[2], status;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );

    // assign const0 variable number 0
    iVar = Vec_IntSize(vObjsUsed);
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );

    iSatVar[0] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit0), vObjsUsed, NULL );
    iSatVar[1] = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit1), vObjsUsed, NULL );

    iSatLit[0] = Abc_Var2Lit( iSatVar[0], Abc_LitIsCompl(iLit0) );
    iSatLit[1] = Abc_Var2Lit( iSatVar[1], Abc_LitIsCompl(iLit1) );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );

    if ( fEquiv )
    {
        Lits[0] = iSatLit[0];
        Lits[1] = Abc_LitNot(iSatLit[1]);
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        if ( status == GLUCOSE_UNSAT )
        {
            Lits[0] = Abc_LitNot(iSatLit[0]);
            Lits[1] = iSatLit[1];
            status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        }
        return status == GLUCOSE_UNSAT;
    }
    else
    {
        Lits[0] = iSatLit[0];
        Lits[1] = iSatLit[1];
        status  = bmcg_sat_solver_solve( pSats[0], Lits, 2 );
        return status == GLUCOSE_SAT;
    }
}